

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O3

int uv_fs_scandir_next(uv_fs_t *req,uv_dirent_t *ent)

{
  void *__ptr;
  long lVar1;
  uint uVar2;
  int iVar3;
  
  lVar1 = req->result;
  if (lVar1 < 0) {
    iVar3 = (int)lVar1;
  }
  else {
    __ptr = req->ptr;
    iVar3 = -0xfff;
    if (__ptr != (void *)0x0) {
      if (req->nbufs == 0) {
        uVar2 = 0;
      }
      else {
        free(*(void **)((long)__ptr + (ulong)(req->nbufs - 1) * 8));
        uVar2 = req->nbufs;
        lVar1 = req->result;
      }
      if (uVar2 == (uint)lVar1) {
        free(__ptr);
        req->ptr = (void *)0x0;
      }
      else {
        req->nbufs = uVar2 + 1;
        lVar1 = *(long *)((long)__ptr + (ulong)uVar2 * 8);
        ent->name = (char *)(lVar1 + 0x13);
        switch(*(undefined1 *)(lVar1 + 0x12)) {
        case 1:
          ent->type = UV_DIRENT_FIFO;
          break;
        case 2:
          ent->type = UV_DIRENT_CHAR;
          break;
        default:
          ent->type = UV_DIRENT_UNKNOWN;
          break;
        case 4:
          ent->type = UV_DIRENT_DIR;
          break;
        case 6:
          ent->type = UV_DIRENT_BLOCK;
          break;
        case 8:
          ent->type = UV_DIRENT_FILE;
          break;
        case 10:
          ent->type = UV_DIRENT_LINK;
          break;
        case 0xc:
          ent->type = UV_DIRENT_SOCKET;
        }
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int uv_fs_scandir_next(uv_fs_t* req, uv_dirent_t* ent) {
  uv__dirent_t** dents;
  uv__dirent_t* dent;
  unsigned int* nbufs;

  /* Check to see if req passed */
  if (req->result < 0)
    return req->result;

  /* Ptr will be null if req was canceled or no files found */
  if (!req->ptr)
    return UV_EOF;

  nbufs = uv__get_nbufs(req);
  assert(nbufs);

  dents = req->ptr;

  /* Free previous entity */
  if (*nbufs > 0)
    uv__fs_scandir_free(dents[*nbufs - 1]);

  /* End was already reached */
  if (*nbufs == (unsigned int) req->result) {
    uv__fs_scandir_free(dents);
    req->ptr = NULL;
    return UV_EOF;
  }

  dent = dents[(*nbufs)++];

  ent->name = dent->d_name;
#ifdef HAVE_DIRENT_TYPES
  switch (dent->d_type) {
    case UV__DT_DIR:
      ent->type = UV_DIRENT_DIR;
      break;
    case UV__DT_FILE:
      ent->type = UV_DIRENT_FILE;
      break;
    case UV__DT_LINK:
      ent->type = UV_DIRENT_LINK;
      break;
    case UV__DT_FIFO:
      ent->type = UV_DIRENT_FIFO;
      break;
    case UV__DT_SOCKET:
      ent->type = UV_DIRENT_SOCKET;
      break;
    case UV__DT_CHAR:
      ent->type = UV_DIRENT_CHAR;
      break;
    case UV__DT_BLOCK:
      ent->type = UV_DIRENT_BLOCK;
      break;
    default:
      ent->type = UV_DIRENT_UNKNOWN;
  }
#else
  ent->type = UV_DIRENT_UNKNOWN;
#endif

  return 0;
}